

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BERDecode.cpp
# Opt level: O3

string * __thiscall OIDType::string_abi_cxx11_(OIDType *this)

{
  string *psVar1;
  pointer puVar2;
  bool bVar3;
  byte bVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  byte *pbVar8;
  ulong uVar9;
  char buffer [16];
  undefined8 local_48;
  undefined8 uStack_40;
  
  psVar1 = &this->_value;
  if ((this->_value)._M_string_length == 0) {
    puVar2 = (this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    std::__cxx11::string::_M_replace((ulong)psVar1,0,(char *)0x0,0x178182);
    if ((this->valid == true) &&
       (iVar6 = ~*(uint *)&(this->data).
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start +
                *(int *)&(this->data).
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish, 0 < iVar6)) {
      pbVar8 = puVar2 + 1;
      do {
        uStack_40 = 0;
        bVar4 = *pbVar8;
        if ((char)bVar4 < '\0') {
          uVar9 = 1;
          uVar5 = 0;
          do {
            if ((iVar6 <= (int)uVar9) || (0x7ffffffe < (long)uVar5)) break;
            uVar5 = (uVar5 | bVar4 & 0x7f) << 7;
            bVar4 = pbVar8[uVar9];
            uVar9 = uVar9 + 1;
          } while ((char)bVar4 < '\0');
          uVar9 = uVar9 & 0xffffffff;
        }
        else {
          uVar9 = 1;
          uVar5 = 0;
        }
        pbVar8 = pbVar8 + uVar9;
        local_48 = 0x2e;
        long_to_buf((char *)((long)&local_48 + 1),bVar4 + uVar5,0);
        std::__cxx11::string::append((char *)psVar1);
        iVar7 = iVar6 - (int)uVar9;
        bVar3 = (int)uVar9 <= iVar6;
        iVar6 = iVar7;
      } while (iVar7 != 0 && bVar3);
    }
  }
  return psVar1;
}

Assistant:

const std::string& OIDType::string() {
    if(!this->_value.length()){
        const uint8_t* dataPtr = this->data.data();

        this->_value = ".1.3";
        if(!this->valid) return this->_value;

        dataPtr++;

        int i = this->data.size() - 1;
        char buffer[16];

        while(i > 0){
            memset(buffer, 0, sizeof(buffer));
            long item = 0;
            int itemLength = decode_ber_longform_integer(dataPtr, &item, i);
            dataPtr += itemLength; i -= itemLength;

            buffer[0] = '.';
            long_to_buf(buffer+1, item);
            this->_value.append(buffer);
        }
    }
    return this->_value;
}